

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

void __thiscall wasm::Try::finalize(Try *this)

{
  size_t sVar1;
  Type TVar2;
  ulong uVar3;
  double dVar4;
  undefined1 local_78 [8];
  unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
  types;
  undefined1 local_38 [5];
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  types._M_h._M_single_bucket = (__node_base_ptr)(this->body->type).id;
  std::
  _Hashtable<wasm::Type,wasm::Type,std::allocator<wasm::Type>,std::__detail::_Identity,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<wasm::Type_const*>
            ((_Hashtable<wasm::Type,wasm::Type,std::allocator<wasm::Type>,std::__detail::_Identity,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_78,&types._M_h._M_single_bucket,local_38,0,&local_33,&local_32,&local_31);
  sVar1 = (this->catchBodies).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  dVar4 = ceil((((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
               (double)(float)types._M_h._M_element_count);
  std::
  _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::rehash((_Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)local_78,(long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4);
  sVar1 = (this->catchBodies).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  if (sVar1 != 0) {
    uVar3 = 0;
    do {
      if ((this->catchBodies).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          uVar3) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      types._M_h._M_single_bucket = (__node_base_ptr)local_78;
      std::
      _Hashtable<wasm::Type,wasm::Type,std::allocator<wasm::Type>,std::__detail::_Identity,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::Type_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Type,true>>>>
                ((_Hashtable<wasm::Type,wasm::Type,std::allocator<wasm::Type>,std::__detail::_Identity,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_78,
                 &(this->catchBodies).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                  [uVar3]->type,&types._M_h._M_single_bucket);
      uVar3 = uVar3 + 1;
    } while (sVar1 != uVar3);
  }
  TVar2 = wasm::Type::
          getLeastUpperBound<std::unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>>
                    ((unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                      *)local_78);
  (this->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.type.id = TVar2.id;
  std::
  _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_78);
  return;
}

Assistant:

void Try::finalize() {
  // If none of the component bodies' type is a supertype of the others, assume
  // the current type is already correct. TODO: Calculate a proper LUB.
  std::unordered_set<Type> types{body->type};
  types.reserve(catchBodies.size());
  for (auto catchBody : catchBodies) {
    types.insert(catchBody->type);
  }
  type = Type::getLeastUpperBound(types);
}